

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueType.cpp
# Opt level: O3

bool __thiscall ValueType::IsNotNativeArray(ValueType *this)

{
  bool bVar1;
  ObjectType OVar2;
  
  bVar1 = true;
  if (((this->field_0).bits & (PrimitiveOrObject|Object|Likely)) != 0) {
    if (((this->field_0).bits & (Object|Null|Undefined|Likely)) == Object) {
      OVar2 = GetObjectType(this);
      if ((OVar2 != ObjectWithArray) && (OVar2 = GetObjectType(this), OVar2 != Array)) {
        return true;
      }
      bVar1 = HasVarElements(this);
      return bVar1;
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ValueType::IsNotNativeArray() const
{
    return
        IsNotObject() ||
        (
            IsObject() &&
            ((GetObjectType() != ObjectType::ObjectWithArray && GetObjectType() != ObjectType::Array) || HasVarElements())
        );
}